

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O1

void sigmund_npts(t_sigmund *x,t_floatarg f)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  t_sample *ptVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = x->x_npts;
  uVar7 = (uint)f;
  if ((int)uVar7 < 0x80) {
    uVar7 = 0x80;
    post("sigmund~: minimum points %d");
  }
  if (0x400000 < uVar7) {
    uVar7 = 0x400000;
    post("sigmund~: maximum points %d");
  }
  bVar5 = 0xff;
  uVar3 = (ulong)uVar7;
  do {
    bVar5 = bVar5 + 1;
    uVar6 = (uint)uVar3;
    uVar3 = uVar3 >> 1;
  } while (1 < uVar6);
  if (uVar7 != 1 << (bVar5 & 0x1f)) {
    bVar5 = 0xff;
    uVar3 = (ulong)uVar7;
    do {
      uVar3 = uVar3 >> 1;
      bVar5 = bVar5 + 1;
      bVar2 = 1 < uVar7;
      uVar7 = (uint)uVar3;
    } while (bVar2);
    uVar7 = 1 << (bVar5 & 0x1f);
    post("sigmund~: adjusting analysis size to %d points");
  }
  if (uVar7 != uVar1) {
    x->x_infill = 0;
    x->x_countdown = 0;
  }
  if (x->x_mode == 1) {
    if (x->x_inbuf == (t_sample *)0x0) {
      ptVar4 = (t_sample *)getbytes((long)(int)uVar7 << 2);
      x->x_inbuf = ptVar4;
      memset(ptVar4,0,(long)(int)uVar7 << 2);
    }
    else {
      ptVar4 = (t_sample *)resizebytes(x->x_inbuf,(long)(int)uVar1 << 2,(long)(int)uVar7 << 2);
      x->x_inbuf = ptVar4;
    }
  }
  else {
    x->x_inbuf = (t_sample *)0x0;
  }
  x->x_npts = uVar7;
  return;
}

Assistant:

static void sigmund_npts(t_sigmund *x, t_floatarg f)
{
    int nwas = x->x_npts, npts = f;
        /* check parameter ranges */
    if (npts < NPOINTS_MIN)
        post("sigmund~: minimum points %d", NPOINTS_MIN),
            npts = NPOINTS_MIN;
    if (npts > NPOINTS_MAX)
        post("sigmund~: maximum points %d", NPOINTS_MAX),
            npts = NPOINTS_MAX;

    if (npts != (1 << sigmund_ilog2(npts)))
        post("sigmund~: adjusting analysis size to %d points",
            (npts = (1 << sigmund_ilog2(npts))));
    if (npts != nwas)
        x->x_countdown = x->x_infill  = 0;
    if (x->x_mode == MODE_STREAM)
    {
        if (x->x_inbuf)
        {
            x->x_inbuf = (t_sample *)t_resizebytes(x->x_inbuf,
                sizeof(*x->x_inbuf) * nwas, sizeof(*x->x_inbuf) * npts);
#ifdef MSP
            x->x_inbuf2 = (t_sample *)t_resizebytes(x->x_inbuf2,
                sizeof(*x->x_inbuf2) * nwas, sizeof(*x->x_inbuf2) * npts);
#endif
        }
        else
        {
            x->x_inbuf = (t_sample *)getbytes(sizeof(*x->x_inbuf) * npts);
            memset((char *)(x->x_inbuf), 0, sizeof(*x->x_inbuf) * npts);
#ifdef MSP
            x->x_inbuf2 = (t_sample *)getbytes(sizeof(*x->x_inbuf2) * npts);
            memset((char *)(x->x_inbuf2), 0, sizeof(*x->x_inbuf2) * npts);
#endif
        }
    }
    else x->x_inbuf = 0;
    x->x_npts = npts;
}